

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipFieldMessage(ParserImpl *this)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  Nonnull<char_*> pcVar4;
  AlphaNum *in_R8;
  char *__end;
  bool bVar5;
  string_view message;
  string delimiter;
  string local_e0;
  AlphaNum local_b0;
  AlphaNum local_80;
  string local_50;
  
  iVar3 = this->recursion_limit_;
  this->recursion_limit_ = iVar3 + -1;
  if (iVar3 < 1) {
    local_e0._M_dataplus._M_p = (pointer)0x4b;
    local_e0._M_string_length = 0x494807;
    pcVar1 = local_b0.digits_;
    pcVar4 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                       (this->initial_recursion_limit_,pcVar1);
    local_b0.piece_._M_len = (long)pcVar4 - (long)pcVar1;
    local_80.piece_._M_len = 1;
    local_80.piece_._M_str = ".";
    local_b0.piece_._M_str = pcVar1;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_50,(lts_20250127 *)&local_e0,&local_b0,&local_80,in_R8);
    message._M_str = local_50._M_dataplus._M_p;
    message._M_len = local_50._M_string_length;
    ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,message);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    bVar2 = false;
  }
  else {
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    local_e0._M_string_length = 0;
    local_e0.field_2._M_local_buf[0] = '\0';
    bVar2 = ConsumeMessageDelimiter(this,&local_e0);
    if (bVar2) {
      do {
        local_b0.piece_._M_len = (size_t)local_b0.digits_;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,">","");
        pcVar1 = (char *)(this->tokenizer_).current_.text._M_string_length;
        if (pcVar1 == local_b0.piece_._M_str) {
          if (pcVar1 == (char *)0x0) {
            bVar2 = true;
          }
          else {
            iVar3 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,
                         (void *)local_b0.piece_._M_len,(size_t)pcVar1);
            bVar2 = iVar3 == 0;
          }
        }
        else {
          bVar2 = false;
        }
        if (bVar2) {
LAB_0030caeb:
          bVar5 = false;
        }
        else {
          local_80.piece_._M_len = (size_t)local_80.digits_;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"}","");
          pcVar1 = (char *)(this->tokenizer_).current_.text._M_string_length;
          bVar5 = true;
          if (pcVar1 == local_80.piece_._M_str) {
            if (pcVar1 == (char *)0x0) goto LAB_0030caeb;
            iVar3 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,
                         (void *)local_80.piece_._M_len,(size_t)pcVar1);
            bVar5 = iVar3 != 0;
          }
        }
        if ((!bVar2) && ((char *)local_80.piece_._M_len != local_80.digits_)) {
          operator_delete((void *)local_80.piece_._M_len,local_80.digits_._0_8_ + 1);
        }
        if ((char *)local_b0.piece_._M_len != local_b0.digits_) {
          operator_delete((void *)local_b0.piece_._M_len,local_b0.digits_._0_8_ + 1);
        }
        if (!bVar5) {
          bVar2 = Consume(this,&local_e0);
          if (bVar2) {
            this->recursion_limit_ = this->recursion_limit_ + 1;
            bVar2 = true;
            goto LAB_0030cc4a;
          }
          break;
        }
        bVar2 = SkipField(this);
      } while (bVar2);
    }
    bVar2 = false;
LAB_0030cc4a:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,
                      CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                               local_e0.field_2._M_local_buf[0]) + 1);
    }
  }
  return bVar2;
}

Assistant:

bool SkipFieldMessage() {
    if (--recursion_limit_ < 0) {
      ReportError(
          absl::StrCat("Message is too deep, the parser exceeded the "
                       "configured recursion limit of ",
                       initial_recursion_limit_, "."));
      return false;
    }

    std::string delimiter;
    DO(ConsumeMessageDelimiter(&delimiter));
    while (!LookingAt(">") && !LookingAt("}")) {
      DO(SkipField());
    }
    DO(Consume(delimiter));

    ++recursion_limit_;
    return true;
  }